

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O3

int anon_unknown.dwarf_23be6::Choose(int n)

{
  int *piVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (n < 1) {
    die("n > 0 failed at line __LINE__");
  }
  uVar11 = n - 1;
  if (n != 1) {
    uVar10 = 0;
    do {
      plVar5 = (anonymous_namespace)::Shmem;
      if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') {
LAB_0026251d:
        pthread_mutex_unlock((pthread_mutex_t *)(plVar5 + 1));
        exit(-1);
      }
      _Var2 = fork();
      iVar4 = (anonymous_namespace)::Depth;
      if (_Var2 == 0) {
        LOCK();
        (anonymous_namespace)::Id = *(anonymous_namespace)::Shmem;
        *(anonymous_namespace)::Shmem = *(anonymous_namespace)::Shmem + 1;
        UNLOCK();
        uVar11 = 1;
        if (uVar10 < 10) goto LAB_00262448;
        uVar9 = (ulong)uVar10;
        uVar12 = 4;
        goto LAB_00262329;
      }
      if (_Var2 == -1) {
        die("fork failed");
      }
      lVar13 = (long)(anonymous_namespace)::Depth;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1));
      if (iVar3 != 0) {
        die("lock failed");
      }
      if (99 < iVar4) {
        die("oops, you\'ll need to rebuild opt-fuzz with a larger MAX_DEPTH");
      }
      if ((int)(anonymous_namespace)::Cores._128_4_ <
          *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) {
        die("Shmem->Running <= Cores failed at line __LINE__");
      }
      while (plVar5 = (anonymous_namespace)::Shmem,
            (int)(anonymous_namespace)::Cores._128_4_ <=
            *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) {
        piVar1 = (int *)((long)(anonymous_namespace)::Shmem + lVar13 * 4 + 0x12f8);
        *piVar1 = *piVar1 + 1;
        if ((char)plVar5[0x292] == '\x01') goto LAB_0026251d;
        iVar4 = pthread_cond_wait((pthread_cond_t *)(plVar5 + lVar13 * 6 + 7),
                                  (pthread_mutex_t *)(plVar5 + 1));
        if (iVar4 != 0) {
          die("pthread_cond_wait failed");
        }
        plVar5 = (anonymous_namespace)::Shmem;
        if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') goto LAB_0026251d;
      }
      *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) =
           *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) + 1;
      iVar4 = pthread_mutex_unlock((pthread_mutex_t *)(plVar5 + 1));
      if (iVar4 != 0) {
        die("unlock failed");
      }
      waitpid(-1,(int *)0x0,1);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  uVar10 = -uVar11;
  if (0 < (int)uVar11) {
    uVar10 = uVar11;
  }
  uVar12 = 1;
  if (9 < uVar10) {
    uVar9 = (ulong)uVar10;
    uVar7 = 4;
    do {
      uVar12 = uVar7;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00262374;
      }
      if (uVar6 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00262374;
      }
      if (uVar6 < 10000) goto LAB_00262374;
      uVar9 = uVar9 / 10000;
      uVar7 = uVar12 + 4;
    } while (99999 < uVar6);
    uVar12 = uVar12 + 1;
  }
LAB_00262374:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar12 - (char)((int)uVar11 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_70[0]),uVar12,uVar10);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((anonymous_namespace)::Choices_abi_cxx11_,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return uVar11;
LAB_00262329:
  uVar11 = uVar12;
  uVar7 = (uint)uVar9;
  if (uVar7 < 100) {
    uVar11 = uVar11 - 2;
    goto LAB_00262448;
  }
  if (uVar7 < 1000) {
    uVar11 = uVar11 - 1;
    goto LAB_00262448;
  }
  if (uVar7 < 10000) goto LAB_00262448;
  uVar9 = uVar9 / 10000;
  uVar12 = uVar11 + 4;
  if (uVar7 < 100000) {
    uVar11 = uVar11 + 1;
LAB_00262448:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70[0],uVar11,uVar10);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_40 = *plVar8;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar8;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((anonymous_namespace)::Choices_abi_cxx11_,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    (anonymous_namespace)::Depth = (anonymous_namespace)::Depth + 1;
    uVar11 = getpid();
    srand(uVar11);
    return uVar10;
  }
  goto LAB_00262329;
}

Assistant:

int Choose(int n) {
  assert(n > 0);
  for (int i = 0; i < (n - 1); ++i) {
    if (Shmem->Stop) {
      pthread_mutex_unlock(&Shmem->Lock);
      exit(-1);
    }
    int ret = ::fork();
    if (ret == -1)
      die("fork failed");
    if (ret == 0) {
      // child
      Id = Shmem->NextId.fetch_add(1);
      Choices += std::to_string(i) + " ";
      ++Depth;
      ::srand(::getpid());
      return i;
    }
    // parent
    increase_runners(Depth);
    waitpid(-1, 0, WNOHANG);
  }
  Choices += std::to_string(n - 1) + " ";
  return n - 1;
}